

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

bool __thiscall SimpleLogger::flush(SimpleLogger *this,size_t start_pos)

{
  bool bVar1;
  SimpleLoggerMgr *pSVar2;
  size_type in_RSI;
  SimpleLogger *in_RDI;
  CompElem *elem;
  SimpleLoggerMgr *mgr;
  LogElem *ll_2;
  size_t ii_1;
  LogElem *ll_1;
  size_t ii;
  size_t num;
  unique_lock<std::mutex> ll;
  unique_lock<std::mutex> *in_stack_fffffffffffffef0;
  LogElem *in_stack_fffffffffffffef8;
  CompElem *in_stack_ffffffffffffff18;
  SimpleLoggerMgr *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff50;
  SimpleLogger *in_stack_ffffffffffffff58;
  undefined1 local_90 [16];
  reference local_80;
  size_type local_78;
  reference local_60;
  size_type local_58;
  ulong local_50;
  undefined4 local_48;
  unique_lock<std::mutex> local_40;
  size_type local_30;
  byte local_19;
  __int_type_conflict3 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  atomic<unsigned_int> *local_8;
  
  local_30 = in_RSI;
  std::unique_lock<std::mutex>::unique_lock(&local_40,&in_RDI->flushingLogs);
  bVar1 = std::unique_lock<std::mutex>::owns_lock(&local_40);
  if (bVar1) {
    local_50 = std::vector<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>::size
                         (&in_RDI->logs);
    for (local_58 = local_30; local_58 < local_50; local_58 = local_58 + 1) {
      local_60 = std::vector<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>::
                 operator[](&in_RDI->logs,local_58);
      LogElem::flush(in_stack_fffffffffffffef8,(ofstream *)in_stack_fffffffffffffef0);
    }
    for (local_78 = 0; local_78 < local_30; local_78 = local_78 + 1) {
      local_80 = std::vector<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>::
                 operator[](&in_RDI->logs,local_78);
      LogElem::flush(in_stack_fffffffffffffef8,(ofstream *)in_stack_fffffffffffffef0);
    }
    std::ostream::flush();
    bVar1 = false;
    if (in_RDI->maxLogFileSize != 0) {
      local_90 = std::ostream::tellp();
      in_stack_ffffffffffffff20 = local_90._8_8_;
      in_stack_ffffffffffffff18 = (CompElem *)std::fpos::operator_cast_to_long((fpos *)local_90);
      bVar1 = (long)in_RDI->maxLogFileSize < (long)in_stack_ffffffffffffff18;
    }
    if (bVar1) {
      in_RDI->curRevnum = in_RDI->curRevnum + 1;
      std::ofstream::close();
      getLogFilePath_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      std::operator|(_S_out,_S_app);
      std::ofstream::open((string *)&in_RDI->fs,(_Ios_Openmode)&stack0xffffffffffffff50);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
      pSVar2 = SimpleLoggerMgr::getWithoutInit();
      if (pSVar2 != (SimpleLoggerMgr *)0x0) {
        local_8 = &in_RDI->numCompJobs;
        local_c = 1;
        local_10 = 5;
        local_14 = 1;
        LOCK();
        local_18 = (local_8->super___atomic_base<unsigned_int>)._M_i;
        (local_8->super___atomic_base<unsigned_int>)._M_i =
             (local_8->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
        in_stack_fffffffffffffef0 = (unique_lock<std::mutex> *)operator_new(0x10);
        SimpleLoggerMgr::CompElem::CompElem
                  ((CompElem *)in_stack_fffffffffffffef0,in_RDI->curRevnum - 1,in_RDI);
        SimpleLoggerMgr::addCompElem(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
    }
    local_19 = 1;
  }
  else {
    local_19 = 0;
  }
  local_48 = 1;
  std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffef0);
  return (bool)(local_19 & 1);
}

Assistant:

bool SimpleLogger::flush(size_t start_pos) {
    std::unique_lock<std::mutex> ll(flushingLogs, std::try_to_lock);
    if (!ll.owns_lock()) return false;

    size_t num = logs.size();
    // Circular flush into file.
    for (size_t ii=start_pos; ii<num; ++ii) {
        LogElem& ll = logs[ii];
        ll.flush(fs);
    }
    for (size_t ii=0; ii<start_pos; ++ii) {
        LogElem& ll = logs[ii];
        ll.flush(fs);
    }
    fs.flush();

    if ( maxLogFileSize &&
         fs.tellp() > (int64_t)maxLogFileSize ) {
        // Exceeded limit, make a new file.
        curRevnum++;
        fs.close();
        fs.open(getLogFilePath(curRevnum), std::ofstream::out | std::ofstream::app);

        // Compress it (tar gz). Register to the global queue.
        SimpleLoggerMgr* mgr = SimpleLoggerMgr::getWithoutInit();
        if (mgr) {
            numCompJobs.fetch_add(1);
            SimpleLoggerMgr::CompElem* elem =
                new SimpleLoggerMgr::CompElem(curRevnum-1, this);
            mgr->addCompElem(elem);
        }
    }

    return true;
}